

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void CConsole::ConModCommandAccess(IResult *pResult,void *pUser)

{
  long lVar1;
  int iVar2;
  int iVar3;
  CCommand *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *in_RSI;
  IResult *in_RDI;
  char *pcVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  CCommand *pCommand;
  CConsole *pConsole;
  char aBuf [128];
  int in_stack_ffffffffffffff1c;
  CCommand *in_stack_ffffffffffffff20;
  CConsole *in_stack_ffffffffffffff28;
  char local_88 [80];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*in_RDI->_vptr_IResult[4])(in_RDI,0);
  this = FindCommand(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff1c);
  if (this == (CCommand *)0x0) {
    pcVar4 = local_88;
    iVar2 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
    str_format(pcVar4,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var_01,iVar2));
  }
  else {
    iVar2 = IConsole::IResult::NumArguments(in_RDI);
    if (iVar2 == 2) {
      (*in_RDI->_vptr_IResult[2])(in_RDI,1);
      CCommand::SetAccessLevel(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      iVar2 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
      iVar3 = IConsole::CCommandInfo::GetAccessLevel(&this->super_CCommandInfo);
      pcVar4 = "disabled";
      if (iVar3 != 0) {
        pcVar4 = "enabled";
      }
      str_format(local_88,0x80,"moderator access for \'%s\' is now %s",CONCAT44(extraout_var,iVar2),
                 pcVar4);
    }
    else {
      pcVar4 = local_88;
      iVar2 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
      iVar3 = IConsole::CCommandInfo::GetAccessLevel(&this->super_CCommandInfo);
      pcVar5 = "disabled";
      if (iVar3 != 0) {
        pcVar5 = "enabled";
      }
      str_format(pcVar4,0x80,"moderator access for \'%s\' is %s",CONCAT44(extraout_var_00,iVar2),
                 pcVar5);
    }
  }
  (**(code **)(*in_RSI + 200))(in_RSI,0,"console",local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::ConModCommandAccess(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128];
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), CFGFLAG_SERVER);
	if(pCommand)
	{
		if(pResult->NumArguments() == 2)
		{
			pCommand->SetAccessLevel(pResult->GetInteger(1));
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is now %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
		}
		else
			str_format(aBuf, sizeof(aBuf), "moderator access for '%s' is %s", pResult->GetString(0), pCommand->GetAccessLevel() ? "enabled" : "disabled");
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}